

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtx_setParams(ZSTD_CCtx *cctx,ZSTD_parameters params)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = ZSTD_checkCParams(params.cParams);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = ZSTD_CCtx_setFParams(cctx,params.fParams);
    if (sVar1 < 0xffffffffffffff89) {
      sVar2 = ZSTD_CCtx_setCParams(cctx,params.cParams);
      sVar1 = 0;
      if (0xffffffffffffff88 < sVar2) {
        sVar1 = sVar2;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setParams(ZSTD_CCtx* cctx, ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParams");
    /* First check cParams, because we want to update all or none. */
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    /* Next set fParams, because this could fail if the cctx isn't in init stage. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setFParams(cctx, params.fParams), "");
    /* Finally set cParams, which should succeed. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setCParams(cctx, params.cParams), "");
    return 0;
}